

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Softmax_x86_fma::forward_inplace(Softmax_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint elemcount;
  uint elemcount_00;
  uint elemcount_01;
  int elempack;
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  float *pfVar13;
  uint uVar14;
  ulong uVar15;
  int size;
  int i;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ulong local_e8;
  Mat local_98;
  long local_48;
  Option *local_40;
  ulong local_38;
  
  uVar14 = bottom_top_blob->dims;
  uVar16 = bottom_top_blob->w;
  uVar18 = (ulong)uVar16;
  elemcount = bottom_top_blob->h;
  uVar15 = (ulong)elemcount;
  elemcount_00 = bottom_top_blob->d;
  elemcount_01 = bottom_top_blob->c;
  uVar8 = (ulong)elemcount_01;
  elempack = bottom_top_blob->elempack;
  iVar10 = (this->super_Softmax).axis;
  iVar10 = (iVar10 >> 0x1f & uVar14) + iVar10;
  local_40 = opt;
  if (uVar14 == 1) {
    softmax((float *)bottom_top_blob->data,elempack * uVar16,1);
    bVar22 = false;
    bVar21 = false;
  }
  else {
    bVar20 = iVar10 == 0;
    bVar21 = uVar14 == 2;
    local_48 = CONCAT44(local_48._4_4_,uVar14);
    if ((bVar21) && (iVar10 == 0)) {
      iVar12 = opt->num_threads;
      iVar7 = (int)(uVar16 + iVar12 + -1) / iVar12;
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,iVar7,2,iVar12,4,opt->workspace_allocator);
      if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) {
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) {
          return -100;
        }
        if (local_98.allocator != (Allocator *)0x0) {
          (*(local_98.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_003402d0;
      }
      if (0 < (int)((long)(int)uVar16 / (long)iVar7)) {
        uVar17 = (long)(int)uVar16 / (long)iVar7 & 0xffffffff;
        lVar9 = 0;
        uVar19 = uVar18;
        do {
          iVar5 = get_omp_thread_num();
          iVar6 = (int)uVar19;
          iVar12 = iVar6;
          if (iVar7 <= iVar6) {
            iVar12 = iVar7;
          }
          pfVar13 = (float *)((long)iVar5 * local_98.cstep *
                              CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                             (long)local_98.data);
          softmax((float *)((long)bottom_top_blob->data + lVar9),elemcount,elempack,
                  elempack * uVar16,iVar12,pfVar13,pfVar13 + iVar7);
          lVar9 = lVar9 + (long)elempack * (long)iVar7 * 4;
          uVar19 = (ulong)(uint)(iVar6 - iVar7);
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar20 = true;
      bVar21 = true;
    }
    if ((bool)(bVar21 & 0 < (int)elemcount & iVar10 == 1)) {
      uVar19 = 0;
      do {
        softmax((float *)((long)bottom_top_blob->w * uVar19 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data),uVar16,elempack);
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
    bVar21 = (int)local_48 == 3;
    bVar22 = (int)local_48 == 4;
    if ((bool)((int)local_48 - 3U < 2 & bVar20)) {
      iVar7 = elemcount * uVar16 * elemcount_00;
      iVar12 = local_40->num_threads;
      iVar5 = (iVar12 + iVar7 + -1) / iVar12;
      sVar2 = bottom_top_blob->cstep;
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,iVar5,2,iVar12,4,local_40->workspace_allocator);
      if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) {
        piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar4 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) {
          return -100;
        }
        if (local_98.allocator != (Allocator *)0x0) {
          (*(local_98.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_003402d0;
      }
      if (0 < (int)((long)iVar7 / (long)iVar5)) {
        local_48 = (long)iVar5;
        uVar19 = (long)iVar7 / (long)iVar5 & 0xffffffff;
        lVar11 = elempack * local_48;
        lVar9 = 0;
        do {
          iVar6 = get_omp_thread_num();
          iVar12 = iVar7;
          if (iVar5 <= iVar7) {
            iVar12 = iVar5;
          }
          pfVar13 = (float *)((long)iVar6 * local_98.cstep *
                              CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                             (long)local_98.data);
          softmax((float *)((long)bottom_top_blob->data + lVar9),elemcount_01,elempack,
                  (int)sVar2 * elempack,iVar12,pfVar13,pfVar13 + local_48);
          lVar9 = lVar9 + lVar11 * 4;
          uVar19 = uVar19 - 1;
          iVar7 = iVar7 - iVar5;
        } while (uVar19 != 0);
      }
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  if ((bool)(iVar10 == 2 & bVar22 | bVar21 & iVar10 == 1)) {
    iVar12 = elempack * uVar16;
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    Mat::create(&local_98,iVar12,2,local_40->num_threads,4,local_40->workspace_allocator);
    if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) {
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return -100;
      }
      if (local_98.allocator != (Allocator *)0x0) {
        (*(local_98.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_003402d0;
    }
    local_38 = uVar18;
    if (0 < (int)elemcount_01) {
      local_48 = (long)iVar12;
      local_e8 = 0;
      do {
        if (0 < (int)elemcount_00) {
          uVar18 = 0;
          do {
            iVar7 = bottom_top_blob->w;
            iVar5 = bottom_top_blob->h;
            pvVar1 = bottom_top_blob->data;
            sVar2 = bottom_top_blob->elemsize;
            sVar3 = bottom_top_blob->cstep;
            iVar6 = get_omp_thread_num();
            pfVar13 = (float *)((long)iVar6 * local_98.cstep *
                                CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                               (long)local_98.data);
            softmax((float *)((long)pvVar1 +
                             (long)iVar5 * sVar2 * (long)iVar7 * uVar18 + sVar3 * local_e8 * sVar2),
                    elemcount,1,iVar12,iVar12,pfVar13,pfVar13 + local_48);
            uVar18 = uVar18 + 1;
          } while (elemcount_00 != uVar18);
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 != uVar8);
    }
    uVar18 = local_38;
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar12 = (int)uVar18;
  if ((bool)(0 < (int)elemcount_01 & bVar21 & iVar10 == 2)) {
    uVar19 = 0;
    do {
      if (0 < (int)elemcount) {
        pfVar13 = (float *)(bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar19 +
                           (long)bottom_top_blob->data);
        uVar17 = uVar15;
        do {
          softmax(pfVar13,iVar12,elempack);
          pfVar13 = pfVar13 + elempack * iVar12;
          uVar14 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar14;
        } while (uVar14 != 0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar8);
  }
  if ((bool)(iVar10 == 1 & bVar22)) {
    iVar12 = elempack * iVar12 * elemcount;
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    Mat::create(&local_98,iVar12,2,local_40->num_threads,4,local_40->workspace_allocator);
    if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) {
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar4 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) {
        return -100;
      }
      if (local_98.allocator != (Allocator *)0x0) {
        (*(local_98.allocator)->_vptr_Allocator[3])();
        return -100;
      }
LAB_003402d0:
      if (local_98.data != (void *)0x0) {
        free(local_98.data);
      }
      return -100;
    }
    local_38 = uVar18;
    if (0 < (int)elemcount_01) {
      uVar18 = 0;
      do {
        pvVar1 = bottom_top_blob->data;
        sVar2 = bottom_top_blob->elemsize;
        sVar3 = bottom_top_blob->cstep;
        iVar7 = get_omp_thread_num();
        pfVar13 = (float *)((long)iVar7 * local_98.cstep *
                            CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                           (long)local_98.data);
        softmax((float *)((long)pvVar1 + sVar3 * uVar18 * sVar2),elemcount_00,1,iVar12,iVar12,
                pfVar13,pfVar13 + iVar12);
        uVar18 = uVar18 + 1;
      } while (uVar8 != uVar18);
    }
    uVar18 = local_38;
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((bool)(bVar22 & iVar10 == 3 & 0 < (int)elemcount_01)) {
    local_e8 = 0;
    do {
      if (0 < (int)elemcount_00) {
        pfVar13 = (float *)(bottom_top_blob->cstep * local_e8 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar14 = 0;
        do {
          uVar19 = uVar15;
          if (0 < (int)elemcount) {
            do {
              softmax(pfVar13,(int)uVar18,elempack);
              pfVar13 = pfVar13 + elempack * (int)uVar18;
              uVar16 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != elemcount_00);
      }
      local_e8 = local_e8 + 1;
    } while (local_e8 != uVar8);
  }
  return 0;
}

Assistant:

int Softmax_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int elempack = bottom_top_blob.elempack;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        const int size = w * elempack;

        softmax(ptr, size, 1);
    }

    if (dims == 2 && positive_axis == 0)
    {
        const int size = w;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = w * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, h, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w, elempack);
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        const int size = w * h * d;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = bottom_top_blob.cstep * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, channels, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        const int size = w * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                float* maxsumptr = maxsum.channel(get_omp_thread_num());
                float* maxptr = maxsumptr;
                float* sumptr = maxptr + size;

                softmax(ptr, h, 1, size, size, maxptr, sumptr);
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w, elempack);
                ptr += w * elempack;
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        const int size = w * h * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + size;

            softmax(ptr, d, 1, size, size, maxptr, sumptr);
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w, elempack);
                    ptr += w * elempack;
                }
            }
        }
    }

    return 0;
}